

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void __thiscall
kratos::InterfaceVisitor::visit(InterfaceVisitor *this,InterfaceInstantiationStmt *stmt)

{
  Generator *gen;
  InterfaceRef *ref;
  undefined1 local_28 [8];
  shared_ptr<kratos::IDefinition> def;
  
  ref = stmt->interface_;
  local_28 = (undefined1  [8])
             (ref->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (ref->definition_).super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count
           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _M_use_count + 1;
      UNLOCK();
      ref = stmt->interface_;
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_use_count
           = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _M_use_count + 1;
    }
  }
  gen = Stmt::generator_parent(&stmt->super_Stmt);
  update_interface_definition(this,(shared_ptr<kratos::IDefinition> *)local_28,ref,gen);
  if (def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void visit(InterfaceInstantiationStmt* stmt) override {
        auto def = stmt->interface()->definition();
        update_interface_definition(def, stmt->interface(), stmt->generator_parent());
    }